

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void groupConcatFinalize(sqlite3_context *context)

{
  StrAccum *p;
  char *z;
  StrAccum *pAccum;
  sqlite3_context *context_local;
  
  p = (StrAccum *)sqlite3_aggregate_context(context,0);
  if (p != (StrAccum *)0x0) {
    if (p->accError == '\x12') {
      sqlite3_result_error_toobig(context);
    }
    else if (p->accError == '\a') {
      sqlite3_result_error_nomem(context);
    }
    else {
      z = sqlite3StrAccumFinish(p);
      sqlite3_result_text(context,z,-1,sqlite3_free);
    }
  }
  return;
}

Assistant:

static void groupConcatFinalize(sqlite3_context *context){
  StrAccum *pAccum;
  pAccum = sqlite3_aggregate_context(context, 0);
  if( pAccum ){
    if( pAccum->accError==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(context);
    }else if( pAccum->accError==SQLITE_NOMEM ){
      sqlite3_result_error_nomem(context);
    }else{    
      sqlite3_result_text(context, sqlite3StrAccumFinish(pAccum), -1, 
                          sqlite3_free);
    }
  }
}